

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O1

int erkStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  ARKodeHAdaptMem pAVar4;
  int iVar5;
  void *pvVar6;
  size_t __nmemb;
  code *pcVar7;
  char *msgfmt;
  long lVar8;
  long lVar9;
  
  pvVar2 = ark_mem->step_mem;
  if (pvVar2 == (void *)0x0) {
    arkProcessError(ark_mem,-0x15,0x4c3,"erkStep_Init",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  if (1 < init_type - 1U) {
    if (((ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE) && (ark_mem->user_efun == 0)) &&
       (ark_mem->fixedstep != 0)) {
      ark_mem->user_efun = 0;
      ark_mem->efun = arkEwtSetSmallReal;
      ark_mem->e_data = ark_mem;
    }
    iVar5 = erkStep_SetButcherTable(ark_mem);
    if (iVar5 == 0) {
      iVar5 = erkStep_CheckButcherTable(ark_mem);
      if (iVar5 == 0) {
        piVar3 = *(int **)((long)pvVar2 + 0x28);
        iVar5 = *piVar3;
        pAVar4 = ark_mem->hadapt_mem;
        pAVar4->q = iVar5;
        *(int *)((long)pvVar2 + 0x18) = iVar5;
        iVar5 = piVar3[1];
        pAVar4->p = iVar5;
        *(int *)((long)pvVar2 + 0x1c) = iVar5;
        if (((ark_mem->fixedstep != 0) && (ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE)) ||
           (iVar5 != 0)) {
          if (*(long *)((long)pvVar2 + 0x10) == 0) {
            pvVar6 = calloc((long)*(int *)((long)pvVar2 + 0x20),8);
            *(void **)((long)pvVar2 + 0x10) = pvVar6;
          }
          iVar5 = *(int *)((long)pvVar2 + 0x20);
          if (0 < iVar5) {
            lVar9 = 0;
            lVar8 = 0;
            do {
              iVar5 = arkAllocVec(ark_mem,ark_mem->ewt,
                                  (N_Vector *)(*(long *)((long)pvVar2 + 0x10) + lVar9));
              if (iVar5 == 0) {
                return -0x14;
              }
              lVar8 = lVar8 + 1;
              iVar5 = *(int *)((long)pvVar2 + 0x20);
              lVar9 = lVar9 + 8;
            } while (lVar8 < iVar5);
          }
          __nmemb = (size_t)iVar5;
          lVar8 = ark_mem->liw + __nmemb;
          ark_mem->liw = lVar8;
          iVar1 = *(int *)((long)pvVar2 + 0x68);
          iVar5 = iVar1 + iVar5 * 2 + 2;
          *(int *)((long)pvVar2 + 0x48) = iVar5;
          if (*(long *)((long)pvVar2 + 0x38) == 0) {
            pvVar6 = calloc((long)iVar5,8);
            *(void **)((long)pvVar2 + 0x38) = pvVar6;
            if (pvVar6 == (void *)0x0) {
              return -0x14;
            }
            ark_mem->lrw = ark_mem->lrw + (long)iVar5;
          }
          if (*(long *)((long)pvVar2 + 0x40) == 0) {
            pvVar6 = calloc((long)iVar5,8);
            *(void **)((long)pvVar2 + 0x40) = pvVar6;
            if (pvVar6 == (void *)0x0) {
              return -0x14;
            }
            ark_mem->liw = lVar8 + iVar5;
          }
          if (0 < iVar1) {
            if (*(long *)((long)pvVar2 + 0x70) == 0) {
              pvVar6 = calloc(__nmemb,8);
              *(void **)((long)pvVar2 + 0x70) = pvVar6;
              ark_mem->lrw = ark_mem->lrw + __nmemb;
            }
            if (*(long *)((long)pvVar2 + 0x78) == 0) {
              pvVar6 = calloc(__nmemb,8);
              *(void **)((long)pvVar2 + 0x78) = pvVar6;
              ark_mem->lrw = ark_mem->lrw + __nmemb;
            }
          }
          iVar5 = *(int *)((long)pvVar2 + 0x18);
          if ((iVar5 < 2) || (ark_mem->interp_degree < iVar5)) {
            if ((iVar5 == 1) && (1 < ark_mem->interp_degree)) {
              ark_mem->interp_degree = 1;
            }
          }
          else {
            ark_mem->interp_degree = iVar5 + -1;
          }
          if (ark_mem->do_adjoint == 0) {
            pcVar7 = erkStep_TakeStep;
          }
          else {
            pcVar7 = erkStep_TakeStep_Adjoint;
          }
          ark_mem->step = pcVar7;
          ark_mem->call_fullrhs = 1;
          return 0;
        }
        msgfmt = "Temporal error estimation cannot be performed without embedding coefficients";
        iVar5 = 0x1c6;
      }
      else {
        msgfmt = "Error in Butcher table";
        iVar5 = 0x1b8;
      }
    }
    else {
      msgfmt = "Could not create Butcher table";
      iVar5 = 0x1af;
    }
    arkProcessError(ark_mem,-0x16,iVar5,"erkStep_Init",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,msgfmt);
    return -0x16;
  }
  return 0;
}

Assistant:

int erkStep_Init(ARKodeMem ark_mem, SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                 int init_type)
{
  ARKodeERKStepMem step_mem;
  sunbooleantype reset_efun;
  int retval, j;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
  {
    return (ARK_SUCCESS);
  }

  /* enforce use of arkEwtSmallReal if using a fixed step size,
     an internal error weight function, and not performing accumulated
     temporal error estimation */
  reset_efun = SUNTRUE;
  if (!ark_mem->fixedstep) { reset_efun = SUNFALSE; }
  if (ark_mem->user_efun) { reset_efun = SUNFALSE; }
  if (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE) { reset_efun = SUNFALSE; }
  if (reset_efun)
  {
    ark_mem->user_efun = SUNFALSE;
    ark_mem->efun      = arkEwtSetSmallReal;
    ark_mem->e_data    = ark_mem;
  }

  /* Create Butcher table (if not already set) */
  retval = erkStep_SetButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Could not create Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Check that Butcher table are OK */
  retval = erkStep_CheckButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Error in Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Retrieve/store method and embedding orders now that table is finalized */
  step_mem->q = ark_mem->hadapt_mem->q = step_mem->B->q;
  step_mem->p = ark_mem->hadapt_mem->p = step_mem->B->p;

  /* Ensure that if adaptivity or error accumulation is enabled, then
       method includes embedding coefficients */
  if ((!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) &&
      (step_mem->p == 0))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Temporal error estimation cannot be performed without embedding coefficients");
    return (ARK_ILL_INPUT);
  }

  /* Allocate ARK RHS vector memory, update storage requirements */
  /*   Allocate F[0] ... F[stages-1] if needed */
  if (step_mem->F == NULL)
  {
    step_mem->F = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
  }
  for (j = 0; j < step_mem->stages; j++)
  {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->F[j])))
    {
      return (ARK_MEM_FAIL);
    }
  }
  ark_mem->liw += step_mem->stages; /* pointers */

  /* Allocate reusable arrays for fused vector interface */
  step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + step_mem->nforcing;
  if (step_mem->cvals == NULL)
  {
    step_mem->cvals = (sunrealtype*)calloc(step_mem->nfusedopvecs,
                                           sizeof(sunrealtype));
    if (step_mem->cvals == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->lrw += step_mem->nfusedopvecs;
  }
  if (step_mem->Xvecs == NULL)
  {
    step_mem->Xvecs = (N_Vector*)calloc(step_mem->nfusedopvecs, sizeof(N_Vector));
    if (step_mem->Xvecs == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->liw += step_mem->nfusedopvecs; /* pointers */
  }

  /* Allocate workspace for MRI forcing -- need to allocate here as the
     number of stages may not bet set before this point and we assume
     SetInnerForcing has been called before the first step i.e., methods
     start with a fast integration */
  if (step_mem->nforcing > 0)
  {
    if (!(step_mem->stage_times))
    {
      step_mem->stage_times = (sunrealtype*)calloc(step_mem->stages,
                                                   sizeof(sunrealtype));
      ark_mem->lrw += step_mem->stages;
    }

    if (!(step_mem->stage_coefs))
    {
      step_mem->stage_coefs = (sunrealtype*)calloc(step_mem->stages,
                                                   sizeof(sunrealtype));
      ark_mem->lrw += step_mem->stages;
    }
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->q > 1 && ark_mem->interp_degree > (step_mem->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->q - 1;
  }
  else if (step_mem->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  /* set appropriate TakeStep routine based on problem configuration */
  if (ark_mem->do_adjoint) { ark_mem->step = erkStep_TakeStep_Adjoint; }
  else { ark_mem->step = erkStep_TakeStep; }

  /* Signal to shared arkode module that full RHS evaluations are required */
  ark_mem->call_fullrhs = SUNTRUE;

  return (ARK_SUCCESS);
}